

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_tlbsync(DisasContext_conflict10 *ctx)

{
  byte local_11;
  DisasContext_conflict10 *ctx_local;
  
  if ((ctx->gtse & 1U) == 0) {
    local_11 = 1;
    if ((ctx->pr & 1U) == 0) {
      local_11 = ctx->hv ^ 0xff;
    }
    if ((local_11 & 1) != 0) {
      gen_priv_exception(ctx,1);
      return;
    }
  }
  else if ((ctx->pr & 1U) != 0) {
    gen_priv_exception(ctx,1);
    return;
  }
  if ((ctx->insns_flags & 0x10000000000000) != 0) {
    gen_check_tlb_flush(ctx,true);
  }
  return;
}

Assistant:

static void gen_tlbsync(DisasContext *ctx)
{
    if (ctx->gtse) {
        CHK_SV; /* If gtse is set then tlbsync is supervisor privileged */
    } else {
        CHK_HV; /* Else hypervisor privileged */
    }

    /* BookS does both ptesync and tlbsync make tlbsync a nop for server */
    if (ctx->insns_flags & PPC_BOOKE) {
        gen_check_tlb_flush(ctx, true);
    }
}